

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O2

void __thiscall CommandLineTestRunner::initializeTestRun(CommandLineTestRunner *this)

{
  TestRegistry *pTVar1;
  bool bVar2;
  TestFilter *pTVar3;
  
  pTVar1 = this->registry_;
  pTVar3 = CommandLineArguments::getGroupFilters(this->arguments_);
  (*pTVar1->_vptr_TestRegistry[0xb])(pTVar1,pTVar3);
  pTVar1 = this->registry_;
  pTVar3 = CommandLineArguments::getNameFilters(this->arguments_);
  (*pTVar1->_vptr_TestRegistry[10])(pTVar1,pTVar3);
  bVar2 = CommandLineArguments::isVerbose(this->arguments_);
  if (bVar2) {
    (*this->output_->_vptr_TestOutput[8])(this->output_,1);
  }
  bVar2 = CommandLineArguments::isVeryVerbose(this->arguments_);
  if (bVar2) {
    (*this->output_->_vptr_TestOutput[8])(this->output_,2);
  }
  bVar2 = CommandLineArguments::isColor(this->arguments_);
  if (bVar2) {
    (*this->output_->_vptr_TestOutput[9])();
  }
  bVar2 = CommandLineArguments::runTestsInSeperateProcess(this->arguments_);
  if (bVar2) {
    (*this->registry_->_vptr_TestRegistry[0x17])();
  }
  bVar2 = CommandLineArguments::isRunIgnored(this->arguments_);
  if (bVar2) {
    TestRegistry::setRunIgnored(this->registry_);
    return;
  }
  return;
}

Assistant:

void CommandLineTestRunner::initializeTestRun()
{
    registry_->setGroupFilters(arguments_->getGroupFilters());
    registry_->setNameFilters(arguments_->getNameFilters());

    if (arguments_->isVerbose()) output_->verbose(TestOutput::level_verbose);
    if (arguments_->isVeryVerbose()) output_->verbose(TestOutput::level_veryVerbose);
    if (arguments_->isColor()) output_->color();
    if (arguments_->runTestsInSeperateProcess()) registry_->setRunTestsInSeperateProcess();
    if (arguments_->isRunIgnored()) registry_->setRunIgnored();
}